

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::EnumOptions::~EnumOptions(EnumOptions *this)

{
  ~EnumOptions(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

EnumOptions::~EnumOptions() {
  // @@protoc_insertion_point(destructor:google.protobuf.EnumOptions)
  SharedDtor(*this);
}